

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

float ImGui::SliderCalcRatioFromValueT<unsigned_int,float>
                (ImGuiDataType data_type,uint v,uint v_min,uint v_max,float power,
                float linear_zero_pos)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  
  fVar3 = 0.0;
  uVar2 = v_max - v_min;
  if (uVar2 != 0) {
    uVar1 = v_max;
    if (v_min < v_max) {
      uVar1 = v_min;
    }
    if (v_max < v_min) {
      v_max = v_min;
    }
    if (v < v_max) {
      v_max = v;
    }
    if (v < uVar1) {
      v_max = uVar1;
    }
    if (((data_type & 0xfffffffeU) == 8) && ((power != 1.0 || (NAN(power))))) {
      fVar3 = powf((float)((ulong)(v_max - v_min) / (ulong)uVar2),1.0 / power);
      return fVar3 * (1.0 - linear_zero_pos) + linear_zero_pos;
    }
    fVar3 = (float)(v_max - v_min) / (float)uVar2;
  }
  return fVar3;
}

Assistant:

float ImGui::SliderCalcRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, float power, float linear_zero_pos)
{
    if (v_min == v_max)
        return 0.0f;

    const bool is_power = (power != 1.0f) && (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_power)
    {
        if (v_clamped < 0.0f)
        {
            const float f = 1.0f - (float)((v_clamped - v_min) / (ImMin((TYPE)0, v_max) - v_min));
            return (1.0f - ImPow(f, 1.0f/power)) * linear_zero_pos;
        }
        else
        {
            const float f = (float)((v_clamped - ImMax((TYPE)0, v_min)) / (v_max - ImMax((TYPE)0, v_min)));
            return linear_zero_pos + ImPow(f, 1.0f/power) * (1.0f - linear_zero_pos);
        }
    }

    // Linear slider
    return (float)((FLOATTYPE)(v_clamped - v_min) / (FLOATTYPE)(v_max - v_min));
}